

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-dos.cc
# Opt level: O3

bool __thiscall DataSourceDOS::check(DataSourceDOS *this)

{
  string *psVar1;
  pointer pcVar2;
  int iVar3;
  long *plVar4;
  Stream *this_00;
  long *plVar5;
  bool bVar6;
  long lVar7;
  pointer pbVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string file_path;
  __string_type __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  default_file_names;
  string file_name;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  undefined1 local_110 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  ostream *local_e0 [2];
  string *local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"SPAE.PA","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"SPAF.PA","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"SPAD.PA","");
  plVar4 = local_40;
  local_50[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"SPAU.PA","");
  __l._M_len = 4;
  __l._M_array = &local_b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c8,__l,(allocator_type *)&local_130);
  lVar7 = -0x80;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  psVar1 = &(this->super_DataSourceLegacy).super_DataSourceBase.path;
  iVar3 = (*(this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source[0xe])
                    (this,psVar1);
  bVar6 = true;
  if ((char)iVar3 == '\0') {
    if (local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar8 = local_c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_d0 = (string *)psVar1;
      do {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        pcVar2 = (pbVar8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar2,pcVar2 + pbVar8->_M_string_length);
        local_110._0_8_ = local_110 + 0x10;
        pcVar2 = (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_110,pcVar2,
                   pcVar2 + (this->super_DataSourceLegacy).super_DataSourceBase.path.
                            _M_string_length);
        std::__cxx11::string::_M_replace_aux((ulong)local_110,local_110._8_8_,0,'\x01');
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_110,(ulong)local_b0._M_dataplus._M_p);
        local_130 = &local_120;
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_120 = *plVar5;
          lStack_118 = plVar4[3];
        }
        else {
          local_120 = *plVar5;
          local_130 = (long *)*plVar4;
        }
        local_128 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_,(ulong)(local_110._16_8_ + 1));
        }
        local_f0._M_allocated_capacity = (size_type)(local_110 + 0x30);
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_110 + 0x20),"data","");
        Log::Logger::operator[]((Logger *)local_110,(string *)&Log::Info);
        this_00 = Log::Stream::operator<<((Stream *)local_110,"Looking for game data in \'");
        std::__ostream_insert<char,std::char_traits<char>>
                  (this_00->stream,(char *)local_130,local_128);
        Log::Stream::operator<<(this_00,"\'...");
        Log::Stream::~Stream((Stream *)local_110);
        if ((undefined1 *)local_f0._M_allocated_capacity != local_110 + 0x30) {
          operator_delete((void *)local_f0._M_allocated_capacity,(ulong)(local_e0[0] + 1));
        }
        iVar3 = (*(this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source[0xe]
                )(this,&local_130);
        if ((char)iVar3 != '\0') {
          std::__cxx11::string::operator=(local_d0,(string *)&local_130);
          if (local_130 != &local_120) {
            operator_delete(local_130,local_120 + 1);
          }
          bVar6 = true;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0012bd8c;
        }
        if (local_130 != &local_120) {
          operator_delete(local_130,local_120 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != local_c8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    bVar6 = false;
  }
LAB_0012bd8c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  return bVar6;
}

Assistant:

bool
DataSourceDOS::check() {
  std::vector<std::string> default_file_names = {
    "SPAE.PA",  // English
    "SPAF.PA",  // French
    "SPAD.PA",  // German
    "SPAU.PA"   // Engish (US)
  };

  if (check_file(path)) {
    return true;
  }

  for (std::string file_name : default_file_names) {
    std::string file_path = path + '/' + file_name;
    Log::Info["data"] << "Looking for game data in '" << file_path << "'...";
    if (check_file(file_path)) {
      path = std::move(file_path);
      return true;
    }
  }

  return false;
}